

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt16x8OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDInt16x8Operation::OpNotEqual(SIMDValue *aValue,SIMDValue *bValue)

{
  _x86_SIMDValue _Var1;
  _x86_SIMDValue _Var2;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar3;
  X86SIMDValue negativeOnes;
  X86SIMDValue tmpbValue;
  X86SIMDValue tmpaValue;
  X86SIMDValue tmpResult;
  X86SIMDValue x86Result;
  SIMDValue *bValue_local;
  SIMDValue *aValue_local;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  short local_18;
  short sStack_16;
  short sStack_14;
  short sStack_12;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sStack_a;
  
  _Var1 = _x86_SIMDValue::ToX86SIMDValue(aValue);
  _Var2 = _x86_SIMDValue::ToX86SIMDValue(bValue);
  local_18 = _Var1.field_0._0_2_;
  sStack_16 = _Var1.field_0._2_2_;
  sStack_14 = _Var1.field_0._4_2_;
  sStack_12 = _Var1.field_0._6_2_;
  sStack_10 = _Var1.field_0._8_2_;
  sStack_e = _Var1.field_0._10_2_;
  sStack_c = _Var1.field_0._12_2_;
  sStack_a = _Var1.field_0._14_2_;
  local_28 = _Var2.field_0._0_2_;
  sStack_26 = _Var2.field_0._2_2_;
  sStack_24 = _Var2.field_0._4_2_;
  sStack_22 = _Var2.field_0._6_2_;
  sStack_20 = _Var2.field_0._8_2_;
  sStack_1e = _Var2.field_0._10_2_;
  sStack_1c = _Var2.field_0._12_2_;
  sStack_1a = _Var2.field_0._14_2_;
  tmpResult.field_0.i16[0] = -(ushort)(sStack_10 == sStack_20);
  tmpResult.field_0.i16[1] = -(ushort)(sStack_e == sStack_1e);
  tmpResult.field_0.i16[2] = -(ushort)(sStack_c == sStack_1c);
  tmpResult.field_0.i16[3] = -(ushort)(sStack_a == sStack_1a);
  tmpResult.field_0.i64[1] =
       ~CONCAT26(-(ushort)(sStack_12 == sStack_22),
                 CONCAT24(-(ushort)(sStack_14 == sStack_24),
                          CONCAT22(-(ushort)(sStack_16 == sStack_26),-(ushort)(local_18 == local_28)
                                  )));
  aVar3 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&tmpResult.field_0 + 8));
  return (SIMDValue)aVar3;
}

Assistant:

SIMDValue SIMDInt16x8Operation::OpNotEqual(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        X86SIMDValue x86Result, tmpResult;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);
        tmpResult.m128i_value = _mm_cmpeq_epi16(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a == b?
        X86SIMDValue negativeOnes = { { -1, -1, -1, -1} };
        x86Result.m128i_value = _mm_andnot_si128(tmpResult.m128i_value, negativeOnes.m128i_value);
        return X86SIMDValue::ToSIMDValue(x86Result);
    }